

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::CleanStringLineEndings(string *str,bool auto_end_last_line)

{
  pointer pcVar1;
  size_type sVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  lVar8 = 0;
  lVar12 = 0;
  lVar11 = lVar12;
  lVar9 = lVar8;
  bVar4 = false;
LAB_0033a330:
  if ((long)sVar2 <= lVar8) {
    if ((bVar4) || (((auto_end_last_line && (0 < lVar12)) && (pcVar1[lVar12 + -1] != '\n')))) {
      std::__cxx11::string::resize((ulong)str,(char)lVar12 + '\x01');
      (str->_M_dataplus)._M_p[lVar12] = '\n';
    }
    else if (lVar12 < (long)sVar2) {
      std::__cxx11::string::resize((ulong)str,(char)lVar12);
      return;
    }
    return;
  }
  lVar7 = lVar9;
  lVar6 = lVar11;
  if ((!bVar4) && (lVar7 = lVar8, lVar6 = lVar12, lVar8 + 8 < (long)sVar2)) goto code_r0x0033a348;
  goto LAB_0033a384;
code_r0x0033a348:
  uVar3 = *(ulong *)(pcVar1 + lVar8);
  uVar10 = (0xe0e0e0e0e0e0e0d - uVar3 | uVar3) & 0x8080808080808080;
  if (uVar10 == 0x8080808080808080) {
    if (lVar12 != lVar8) {
      *(ulong *)(pcVar1 + lVar12) = uVar3;
    }
    lVar12 = lVar12 + 8;
    lVar7 = lVar8 + 8;
  }
  lVar6 = lVar12;
  lVar8 = lVar7;
  if (uVar10 == 0x8080808080808080) goto LAB_0033a330;
LAB_0033a384:
  lVar12 = lVar6;
  if (pcVar1[lVar7] == '\n') {
    if (lVar7 != lVar12) {
      pcVar1[lVar12] = '\n';
    }
  }
  else {
    if (pcVar1[lVar7] == '\r') {
      bVar5 = true;
      if (bVar4) {
        pcVar1[lVar12] = '\n';
        lVar12 = lVar12 + 1;
      }
      goto LAB_0033a3d5;
    }
    if (bVar4) {
      pcVar1[lVar12] = '\n';
      lVar12 = lVar12 + 1;
    }
    if (lVar7 != lVar12) {
      pcVar1[lVar12] = pcVar1[lVar7];
    }
  }
  lVar12 = lVar12 + 1;
  bVar5 = false;
LAB_0033a3d5:
  lVar8 = lVar7 + 1;
  lVar11 = lVar12;
  lVar9 = lVar8;
  bVar4 = bVar5;
  goto LAB_0033a330;
}

Assistant:

void CleanStringLineEndings(std::string *str, bool auto_end_last_line) {
  ptrdiff_t output_pos = 0;
  bool r_seen = false;
  ptrdiff_t len = str->size();

  char *p = &(*str)[0];

  for (ptrdiff_t input_pos = 0; input_pos < len;) {
    if (!r_seen && input_pos + 8 < len) {
      uint64_t v = GOOGLE_UNALIGNED_LOAD64(p + input_pos);
      // Loop over groups of 8 bytes at a time until we come across
      // a word that has a byte whose value is less than or equal to
      // '\r' (i.e. could contain a \n (0x0a) or a \r (0x0d) ).
      //
      // We use a has_less macro that quickly tests a whole 64-bit
      // word to see if any of the bytes has a value < N.
      //
      // For more details, see:
      //   http://graphics.stanford.edu/~seander/bithacks.html#HasLessInWord
#define has_less(x, n) (((x) - ~0ULL / 255 * (n)) & ~(x) & ~0ULL / 255 * 128)
      if (!has_less(v, '\r' + 1)) {
#undef has_less
        // No byte in this word has a value that could be a \r or a \n
        if (output_pos != input_pos) {
          GOOGLE_UNALIGNED_STORE64(p + output_pos, v);
        }
        input_pos += 8;
        output_pos += 8;
        continue;
      }
    }
    std::string::const_reference in = p[input_pos];
    if (in == '\r') {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = true;
    } else if (in == '\n') {
      if (input_pos != output_pos)
        p[output_pos++] = '\n';
      else
        output_pos++;
      r_seen = false;
    } else {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = false;
      if (input_pos != output_pos)
        p[output_pos++] = in;
      else
        output_pos++;
    }
    input_pos++;
  }
  if (r_seen ||
      (auto_end_last_line && output_pos > 0 && p[output_pos - 1] != '\n')) {
    str->resize(output_pos + 1);
    str->operator[](output_pos) = '\n';
  } else if (output_pos < len) {
    str->resize(output_pos);
  }
}